

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

cf_errno_t cf_file_getcwd(cf_char_t *cwd,cf_size_t size)

{
  char *pcVar1;
  
  if (cwd != (cf_char_t *)0x0) {
    pcVar1 = getcwd(cwd,size);
    return (cf_errno_t)(pcVar1 == (char *)0x0);
  }
  return 2;
}

Assistant:

cf_errno_t  cf_file_getcwd(cf_char_t* cwd, cf_size_t size) {
    if(!cwd) return CF_EPARAM;
#ifdef CF_OS_WIN
    return _getcwd(cwd, size) ? CF_OK : CF_NOK;
#else
    return getcwd(cwd, size) ? CF_OK : CF_NOK;
#endif
}